

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_ssl_connect_nonblocking(connectdata *conn,int sockindex,_Bool *done)

{
  CURLcode CVar1;
  
  if ((ulong)(conn->data->set).ssl.version < 7) {
    conn->ssl[sockindex].use = true;
    CVar1 = Curl_ossl_connect_nonblocking(conn,sockindex,done);
    if ((CVar1 == CURLE_OK) && (CVar1 = CURLE_OK, *done == true)) {
      Curl_pgrsTime(conn->data,TIMER_APPCONNECT);
    }
  }
  else {
    Curl_failf(conn->data,"Unrecognized parameter value passed via CURLOPT_SSLVERSION");
    CVar1 = CURLE_SSL_CONNECT_ERROR;
  }
  return CVar1;
}

Assistant:

CURLcode
Curl_ssl_connect_nonblocking(struct connectdata *conn, int sockindex,
                             bool *done)
{
  CURLcode result;

  if(!ssl_prefs_check(conn->data))
    return CURLE_SSL_CONNECT_ERROR;

  /* mark this is being ssl requested from here on. */
  conn->ssl[sockindex].use = TRUE;
#ifdef curlssl_connect_nonblocking
  result = curlssl_connect_nonblocking(conn, sockindex, done);
#else
  *done = TRUE; /* fallback to BLOCKING */
  result = curlssl_connect(conn, sockindex);
#endif /* non-blocking connect support */
  if(!result && *done)
    Curl_pgrsTime(conn->data, TIMER_APPCONNECT); /* SSL is connected */
  return result;
}